

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::TriggerConditionVisitor::visit(TriggerConditionVisitor *this,Var *var)

{
  int iVar1;
  undefined4 extraout_var;
  string local_38 [8];
  string base_name;
  
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[0x29])(var);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x138))
            (local_38,(long *)CONCAT44(extraout_var,iVar1));
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_M_emplace<std::__cxx11::string&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->values,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void visit(Var *var) override {
        auto base_name = var->get_var_root_parent()->base_name();
        values.emplace(base_name);
    }